

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O1

void printAddress(MCInst *MI,uint Base,int64_t Disp,uint Index,SStream *O)

{
  cs_detail *pcVar1;
  sysz_reg sVar2;
  uint8_t *puVar3;
  
  printInt64(O,Disp);
  if (Base == 0) {
    if (Index != 0) {
      return;
    }
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar1 = MI->flat_insn->detail;
    puVar3 = pcVar1->groups + (ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar3[0] = '\x02';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    pcVar1 = MI->flat_insn->detail;
    puVar3 = pcVar1->groups + (ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 + 0x1d;
  }
  else {
    SStream_concat0(O,"(");
    if (Index != 0) {
      SStream_concat(O,"%%%s, ",
                     getRegisterName_AsmStrs +
                     *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(Index - 1) * 2));
    }
    SStream_concat(O,"%%%s)",
                   getRegisterName_AsmStrs +
                   *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(Base - 1) * 2));
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar1 = MI->flat_insn->detail;
    puVar3 = pcVar1->groups + (ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar3[0] = '\x03';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    sVar2 = SystemZ_map_register(Base);
    pcVar1 = MI->flat_insn->detail;
    pcVar1->groups[(ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 + 0x1d] = (uint8_t)sVar2;
    sVar2 = SystemZ_map_register(Index);
    pcVar1 = MI->flat_insn->detail;
    pcVar1->groups[(ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 + 0x1e] = (uint8_t)sVar2;
    pcVar1 = MI->flat_insn->detail;
    puVar3 = pcVar1->groups + (ulong)(pcVar1->field_6).x86.opcode[0] * 0x20 + 0x2d;
  }
  *(int64_t *)puVar3 = Disp;
  puVar3 = (MI->flat_insn->detail->field_6).x86.opcode;
  *puVar3 = *puVar3 + '\x01';
  return;
}

Assistant:

static void printAddress(MCInst *MI, unsigned Base, int64_t Disp, unsigned Index, SStream *O)
{
	printInt64(O, Disp);

	if (Base) {
		SStream_concat0(O, "(");
		if (Index)
			SStream_concat(O, "%%%s, ", getRegisterName(Index));
		SStream_concat(O, "%%%s)", getRegisterName(Base));

		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_MEM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.base = (uint8_t)SystemZ_map_register(Base);
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.index = (uint8_t)SystemZ_map_register(Index);
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].mem.disp = Disp;
			MI->flat_insn->detail->sysz.op_count++;
		}
	} else if (!Index) {
		if (MI->csh->detail) {
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
			MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = Disp;
			MI->flat_insn->detail->sysz.op_count++;
		}
	}
}